

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
                  *v)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_00;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_01;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_02;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_03;
  type_by_index_t<4UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_04;
  type_by_index_t<5UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_05;
  type_by_index_t<6UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_06;
  tuple<Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *v_local;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
  *this_local;
  
  v_00 = get<0ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,false> *)this,
             v_00);
  v_01 = get<1ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<1ul,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,false>::operator=
            ((tuple_value<1ul,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,false> *)
             (this + 0x10),v_01);
  v_02 = get<2ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<2ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<2ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,false> *)
             (this + 0x20),v_02);
  v_03 = get<3ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<3ul,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,false>::operator=
            ((tuple_value<3ul,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,false> *)
             (this + 0x30),v_03);
  v_04 = get<4ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<4ul,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,false>::operator=
            ((tuple_value<4ul,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,false> *)
             (this + 0x40),v_04);
  v_05 = get<5ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<5ul,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<5ul,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,false> *)
             (this + 0x50),v_05);
  v_06 = get<6ul,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
                   (v);
  tuple_value<6ul,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<6ul,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>,false> *)
             (this + 0x60),v_06);
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }